

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::AddSubDirectory
          (cmMakefile *this,string *srcPath,string *binPath,bool excludeFromAll,bool immediate)

{
  pointer *pppcVar1;
  cmStateSnapshot *__return_storage_ptr__;
  iterator __position;
  bool bVar2;
  cmMakefile *this_00;
  char *val;
  cmInstallSubdirectoryGenerator *this_01;
  cmMakefile *subMf;
  cmStateSnapshot newSnapshot;
  undefined1 local_78 [16];
  undefined1 local_68 [56];
  
  bVar2 = EnforceUniqueDir(this,srcPath,binPath);
  if (!bVar2) {
    return;
  }
  __return_storage_ptr__ = (cmStateSnapshot *)(local_68 + 0x20);
  cmState::CreateBuildsystemDirectorySnapshot
            (__return_storage_ptr__,
             (this->GlobalGenerator->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&this->StateSnapshot);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_78,__return_storage_ptr__);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_78,srcPath);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_78,__return_storage_ptr__);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_78,binPath);
  cmsys::SystemTools::MakeDirectory(binPath,(mode_t *)0x0);
  this_00 = (cmMakefile *)operator_new(0x7e8);
  cmMakefile(this_00,this->GlobalGenerator,__return_storage_ptr__);
  local_68._24_8_ = this_00;
  cmGlobalGenerator::AddMakefile(this->GlobalGenerator,this_00);
  if (!excludeFromAll) {
    local_78._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"EXCLUDE_FROM_ALL","");
    val = GetProperty(this,(string *)local_78);
    bVar2 = cmSystemTools::IsOn(val);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_78._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_68) {
      operator_delete((void *)local_78._0_8_,(ulong)(local_68._0_8_ + 1));
    }
    if (!bVar2) goto LAB_00181ee5;
  }
  local_78._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"EXCLUDE_FROM_ALL","");
  SetProperty(this_00,(string *)local_78,"TRUE");
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_78._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_68) {
    operator_delete((void *)local_78._0_8_,(ulong)(local_68._0_8_ + 1));
  }
LAB_00181ee5:
  if (immediate) {
    ConfigureSubDirectory(this,this_00);
  }
  else {
    __position._M_current =
         (this->UnConfiguredDirectories).
         super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->UnConfiguredDirectories).
        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
                ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)&this->UnConfiguredDirectories,
                 __position,(cmMakefile **)(local_68 + 0x18));
      this_00 = (cmMakefile *)local_68._24_8_;
    }
    else {
      *__position._M_current = this_00;
      pppcVar1 = &(this->UnConfiguredDirectories).
                  super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  this_01 = (cmInstallSubdirectoryGenerator *)operator_new(0xe8);
  cmInstallSubdirectoryGenerator::cmInstallSubdirectoryGenerator
            (this_01,this_00,(binPath->_M_dataplus)._M_p,excludeFromAll);
  AddInstallGenerator(this,(cmInstallGenerator *)this_01);
  return;
}

Assistant:

void cmMakefile::AddSubDirectory(const std::string& srcPath,
                                 const std::string& binPath,
                                 bool excludeFromAll, bool immediate)
{
  // Make sure the binary directory is unique.
  if (!this->EnforceUniqueDir(srcPath, binPath)) {
    return;
  }

  cmStateSnapshot newSnapshot =
    this->GetState()->CreateBuildsystemDirectorySnapshot(this->StateSnapshot);

  newSnapshot.GetDirectory().SetCurrentSource(srcPath);
  newSnapshot.GetDirectory().SetCurrentBinary(binPath);

  cmSystemTools::MakeDirectory(binPath);

  cmMakefile* subMf = new cmMakefile(this->GlobalGenerator, newSnapshot);
  this->GetGlobalGenerator()->AddMakefile(subMf);

  if (excludeFromAll || this->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
    subMf->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }

  if (immediate) {
    this->ConfigureSubDirectory(subMf);
  } else {
    this->UnConfiguredDirectories.push_back(subMf);
  }

  this->AddInstallGenerator(new cmInstallSubdirectoryGenerator(
    subMf, binPath.c_str(), excludeFromAll));
}